

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpndrv.h
# Opt level: O0

void __thiscall CTPNListBase::CTPNListBase(CTPNListBase *this)

{
  CTcConstVal *in_RDI;
  CTPNList *in_stack_ffffffffffffffe8;
  
  CTcPrsNode::CTcPrsNode((CTcPrsNode *)in_RDI);
  *(undefined ***)in_RDI = &PTR___cxa_pure_virtual_003d1448;
  CTcConstVal::CTcConstVal((CTcConstVal *)&in_RDI->field_0x20);
  (in_RDI->val_).propval_ = 0;
  *(undefined8 *)((long)&in_RDI->val_ + 0x10) = 0;
  (in_RDI->val_).floatval_.len_ = 0;
  in_RDI[1].field_0x20 = in_RDI[1].field_0x20 & 0xfe | 1;
  in_RDI[1].field_0x20 = in_RDI[1].field_0x20 & 0xfd;
  CTcConstVal::set_list(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

CTPNListBase()
    {
        /* there are initially no elements */
        cnt_ = 0;
        head_ = tail_ = 0;

        /* 
         *   initially, the list is constant, because it's just an empty
         *   list; as we add elements, we'll check for constants, and
         *   we'll clear the constant flag the first time we add a
         *   non-constant element 
         */
        is_const_ = TRUE;

        /* presume it's not a lookup table list */
        is_lookup_table_ = FALSE;

        /* set my constant value to point to myself */
        const_val_.set_list((class CTPNList *)this);
    }